

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono_time_traits.hpp
# Opt level: O0

duration_type
asio::detail::
chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
::subtract(time_type *t1,time_type *t2)

{
  bool bVar1;
  type __lhs;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RSI;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_RDI;
  time_type epoch;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff88;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff90;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff98;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffa0;
  undefined8 local_8;
  
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_ffffffffffffff90);
  bVar1 = std::chrono::operator>=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar1) {
    bVar1 = std::chrono::operator>=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (bVar1) {
      local_8 = (rep)std::chrono::operator-(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    else {
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::min();
      bVar1 = std::chrono::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (bVar1) {
        local_8 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::max();
      }
      else {
        std::chrono::
        time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        ::max();
        std::chrono::operator-(in_stack_ffffffffffffff98,in_RSI);
        std::chrono::operator-(in_stack_ffffffffffffff98,in_RSI);
        bVar1 = std::chrono::operator<
                          (&in_stack_ffffffffffffffa0->__d,&in_stack_ffffffffffffff98->__d);
        if (bVar1) {
          local_8 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::max();
        }
        else {
          local_8 = (rep)std::chrono::operator-(in_stack_ffffffffffffff98,in_RSI);
        }
      }
    }
  }
  else {
    bVar1 = std::chrono::operator<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (bVar1) {
      local_8 = (rep)std::chrono::operator-(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    else {
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::min();
      bVar1 = std::chrono::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (bVar1) {
        local_8 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::min();
      }
      else {
        std::chrono::
        time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        ::max();
        std::chrono::operator-(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        __lhs = std::chrono::operator-(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        bVar1 = std::chrono::operator<
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)__lhs.__r,
                           &in_stack_ffffffffffffff98->__d);
        if (bVar1) {
          local_8 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::min();
        }
        else {
          std::chrono::operator-(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
          local_8 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator-(in_RDI);
        }
      }
    }
  }
  return (duration_type)local_8;
}

Assistant:

static duration_type subtract(const time_type& t1, const time_type& t2)
  {
    const time_type epoch;
    if (t1 >= epoch)
    {
      if (t2 >= epoch)
      {
        return t1 - t2;
      }
      else if (t2 == (time_type::min)())
      {
        return (duration_type::max)();
      }
      else if ((time_type::max)() - t1 < epoch - t2)
      {
        return (duration_type::max)();
      }
      else
      {
        return t1 - t2;
      }
    }
    else // t1 < epoch
    {
      if (t2 < epoch)
      {
        return t1 - t2;
      }
      else if (t1 == (time_type::min)())
      {
        return (duration_type::min)();
      }
      else if ((time_type::max)() - t2 < epoch - t1)
      {
        return (duration_type::min)();
      }
      else
      {
        return -(t2 - t1);
      }
    }
  }